

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Read
          (CopyingFileInputStream *this,void *buffer,int size)

{
  int iVar1;
  LogMessage *other;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  LogFinisher local_6d;
  int result;
  byte local_59;
  LogMessage local_58;
  int local_1c;
  void *pvStack_18;
  int size_local;
  void *buffer_local;
  CopyingFileInputStream *this_local;
  
  local_59 = 0;
  local_1c = size;
  pvStack_18 = buffer;
  buffer_local = this;
  if ((this->is_closed_ & 1U) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x8a);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  do {
    sVar2 = read(this->file_,pvStack_18,(long)local_1c);
    iVar1 = (int)sVar2;
    bVar4 = false;
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    this->errno_ = *piVar3;
  }
  return iVar1;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Read(void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);

  int result;
  do {
    result = read(file_, buffer, size);
  } while (result < 0 && errno == EINTR);

  if (result < 0) {
    // Read error (not EOF).
    errno_ = errno;
  }

  return result;
}